

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_longnames.cpp
# Opt level: O1

void __thiscall
icu_63::number::impl::LongNameHandler::simpleFormatsToModifiers
          (LongNameHandler *this,UnicodeString *simpleFormats,Field field,UErrorCode *status)

{
  long lVar1;
  undefined8 *puVar2;
  UnicodeString simpleFormat;
  SimpleFormatter compiledFormatter;
  Parameters local_138;
  UnicodeString local_128;
  SimpleFormatter local_e8;
  SimpleModifier local_a0;
  
  puVar2 = (undefined8 *)&this->field_0x58;
  lVar1 = 0;
  do {
    anon_unknown.dwarf_17a18f::getWithPlural(&local_128,simpleFormats,(Form)lVar1,status);
    if (U_ZERO_ERROR < *status) {
LAB_00260cca:
      UnicodeString::~UnicodeString(&local_128);
      return;
    }
    SimpleFormatter::SimpleFormatter(&local_e8,&local_128,0,1,status);
    if (U_ZERO_ERROR < *status) {
      SimpleFormatter::~SimpleFormatter(&local_e8);
      goto LAB_00260cca;
    }
    Modifier::Parameters::Parameters(&local_138,&this->super_ModifierStore,'\0',(Form)lVar1);
    SimpleModifier::SimpleModifier(&local_a0,&local_e8,field,false,local_138);
    UnicodeString::moveFrom((UnicodeString *)(puVar2 + -8),&local_a0.fCompiledPattern);
    *puVar2 = local_a0._72_8_;
    puVar2[1] = local_a0._80_8_;
    puVar2[2] = local_a0._88_8_;
    puVar2[3] = local_a0.fParameters.obj;
    puVar2[4] = local_a0.fParameters._8_8_;
    local_a0.super_Modifier._vptr_Modifier = (_func_int **)&PTR__SimpleModifier_003d9570;
    UnicodeString::~UnicodeString(&local_a0.fCompiledPattern);
    Modifier::~Modifier(&local_a0.super_Modifier);
    SimpleFormatter::~SimpleFormatter(&local_e8);
    UnicodeString::~UnicodeString(&local_128);
    lVar1 = lVar1 + 1;
    puVar2 = puVar2 + 0xe;
    if (lVar1 == 6) {
      return;
    }
  } while( true );
}

Assistant:

void LongNameHandler::simpleFormatsToModifiers(const UnicodeString *simpleFormats, Field field,
                                               UErrorCode &status) {
    for (int32_t i = 0; i < StandardPlural::Form::COUNT; i++) {
        StandardPlural::Form plural = static_cast<StandardPlural::Form>(i);
        UnicodeString simpleFormat = getWithPlural(simpleFormats, plural, status);
        if (U_FAILURE(status)) { return; }
        SimpleFormatter compiledFormatter(simpleFormat, 0, 1, status);
        if (U_FAILURE(status)) { return; }
        fModifiers[i] = SimpleModifier(compiledFormatter, field, false, {this, 0, plural});
    }
}